

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.hpp
# Opt level: O0

void __thiscall helics::apps::Source::~Source(Source *this)

{
  App *in_RDI;
  vector<helics::Endpoint,_std::allocator<helics::Endpoint>_> *unaff_retaddr;
  deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *in_stack_00000040;
  
  in_RDI->_vptr_App = (_func_int **)&PTR__Source_00a473a8;
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          *)0x40b53d);
  CLI::std::vector<helics::Endpoint,_std::allocator<helics::Endpoint>_>::~vector(unaff_retaddr);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          *)0x40b55f);
  CLI::std::
  vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
  ::~vector((vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
             *)unaff_retaddr);
  CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::~deque
            (in_stack_00000040);
  App::~App(in_RDI);
  return;
}

Assistant:

class HELICS_CXX_EXPORT Source: public App {
      public:
        /** default constructor*/
        Source() = default;
        /** construct from command line arguments in a vector
    @param args The vector of string, the remaining arguments are returned in the args
    */
        explicit Source(std::vector<std::string> args);
        /** construct from command line arguments
    @param argc the number of arguments
    @param argv the strings in the input
    */
        Source(int argc, char* argv[]);
        /** construct from a federate info object
    @param name the name of the source object (can be empty to use defaults from fedInfo)
    @param fedInfo a pointer info object containing information on the desired federate
    configuration
    */
        Source(std::string_view name, const FederateInfo& fedInfo);
        /**constructor taking a federate information structure and using the given core
    @param name the name of the source object (can be empty to use defaults from fedInfo)
    @param core a pointer to core object which the federate can join
    @param fedInfo  a federate information structure
    */
        Source(std::string_view name,
               const std::shared_ptr<Core>& core,
               const FederateInfo& fedInfo);

        /**constructor taking a federate information structure and using the given core
    @param name the name of the federate (can be empty to use defaults from fedInfo)
    @param core a coreApp object that can be joined
    @param fedInfo  a federate information structure
    */
        Source(std::string_view name, CoreApp& core, const FederateInfo& fedInfo);
        /**constructor taking a file with the required information
    @param name the name of the source object (can be empty to use defaults from fedInfo)
    @param configString file a JSON or TOML file or string containing configuration informatino
    */
        Source(std::string_view name, const std::string& configString);

        /** move construction*/
        Source(Source&& other_source) = default;

        /** move assignment*/
        Source& operator=(Source&& fed) = default;

        /** initialize the source federate
    @details connect all sources with a generator
    */
        virtual void initialize() override;

        /** run the source until the specified time
    @param stopTime_input the desired stop time
    */
        virtual void runTo(Time stopTime_input) override;

        /** add a publication to a source
    @param key the key of the publication to add
    @param generator the name of the generator to link with
    @param type the type of the publication
    @param period the period of the publication
    @param units the units associated with the publication
    */
        void addPublication(std::string_view key,
                            std::string_view generator,
                            DataType type,
                            Time period,
                            std::string_view units = std::string_view());

        /** add a publication to a source
    @param key the key of the publication to add
    @param type the type of the publication
    @param period the period of the publication
    @param units the units associated with the publication
    */
        void addPublication(std::string_view key,
                            DataType type,
                            Time period,
                            std::string_view units = std::string_view())
        {
            addPublication(key, std::string_view(), type, period, units);
        }
        /** add a signal generator to the source object
    @return an index for later reference of the signal generator
    */
        int addSignalGenerator(std::string_view name, std::string_view type);
        /** set the start time for a publication */
        void setStartTime(std::string_view key, Time startTime);
        /** set the start time for a publication */
        void setPeriod(std::string_view key, Time period);
        /** tie a publication to a signal generator*/
        void linkPublicationToGenerator(std::string_view key, std::string_view generator);
        /** tie a publication to a signal generator*/
        void linkPublicationToGenerator(std::string_view key, int genIndex);
        /** get a pointer to the signal generator*/
        std::shared_ptr<SignalGenerator> getGenerator(int index);

      private:
        /** run any initial setup operations including file loading*/
        void initialSetup();
        /** process remaining command line arguments*/
        void processArgs();
        /** load from a jsonString
    @param jsonString either a JSON filename or a string containing JSON
    */
        virtual void loadJsonFile(const std::string& jsonString,
                                  bool enableFederateInterfaceRegistration) override;
        /** execute a source object and update its time return the next execution time*/
        Time runSource(SourceObject& obj, Time currentTime);
        /** execute all the sources*/
        Time runSourceLoop(Time currentTime);

      private:
        std::deque<SourceObject> sources;  //!< the actual publication objects
        std::vector<std::shared_ptr<SignalGenerator>> generators;  //!< the signal generators
        std::map<std::string_view, int> generatorLookup;  //!< map of generator names to indices
        std::vector<Endpoint> endpoints;  //!< the actual endpoint objects
        std::map<std::string_view, int> pubids;  //!< publication id map
        Time defaultPeriod = 1.0;  //!< the default period of publication
    }